

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check_print.c
# Opt level: O1

void fprint_xml_esc(FILE *file,char *str)

{
  byte bVar1;
  char *__s;
  
  do {
    bVar1 = *str;
    if (bVar1 < 0x27) {
      if (bVar1 == 0x22) {
        __s = "&quot;";
        goto LAB_00158149;
      }
      if (bVar1 == 0x26) {
        __s = "&amp;";
        goto LAB_00158149;
      }
      if (bVar1 == 0) {
        return;
      }
LAB_0015815a:
      if ((byte)(bVar1 - 0x20) < 0x5f) {
        fputc((int)(char)bVar1,(FILE *)file);
      }
      else if (('\x1f' < (char)bVar1) || ((bVar1 < 0xe && ((0x2600U >> (bVar1 & 0x1f) & 1) != 0))))
      {
        fprintf((FILE *)file,"&#x%X;");
      }
    }
    else {
      if (bVar1 == 0x27) {
        __s = "&apos;";
      }
      else if (bVar1 == 0x3c) {
        __s = "&lt;";
      }
      else {
        if (bVar1 != 0x3e) goto LAB_0015815a;
        __s = "&gt;";
      }
LAB_00158149:
      fputs(__s,(FILE *)file);
    }
    str = (char *)((byte *)str + 1);
  } while( true );
}

Assistant:

void fprint_xml_esc(FILE * file, const char *str)
{
    /* The valid XML characters are as follows:
     *   #x9 | #xA | #xD | [#x20-#xD7FF] | [#xE000-#xFFFD] | [#x10000-#x10FFFF]
     * Characters that are outside of ASCII must be encoded. Further, the
     * following special characters:
     *   " ' < > &
     * must be encoded. We assume that the incoming string may be a multibyte
     * character.
     */

    for(; *str != '\0'; str++)
    {
        char next = *str;

        /* handle special characters that must be escaped */
        if(next == '"' || next == '\'' || next == '<' || next == '>' || next == '&')
        {
            switch (next)
            {
                case '"':
                    fputs("&quot;", file);
                    break;
                case '\'':
                    fputs("&apos;", file);
                    break;
                case '<':
                    fputs("&lt;", file);
                    break;
                case '>':
                    fputs("&gt;", file);
                    break;
                case '&':
                    fputs("&amp;", file);
                    break;
                default:
                    /* Program cannot reach here */
                    break;
            }
        }
        /* printable ASCII */
        else if(next >= ' ' && next <= '~')
        {
            fputc(next, file);
        }
        /* Non-printable character */
        else if(next == 0x9 || next == 0xA || next == 0xD ||
                next >= 0x20)
        {
            fprintf(file, "&#x%X;", next);
        }
        /* If it did not get printed, it is not a valid XML character*/
    }
}